

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

number_validator<int> __thiscall goodform::sub_form::int32(sub_form *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined8 *in_RSI;
  number_validator<int> nVar3;
  int32_t val;
  allocator<char> local_5d;
  int local_5c;
  string local_58;
  error_message local_38;
  
  bVar1 = convert<int>((any *)in_RSI[1],&local_5c);
  uVar2 = extraout_RDX;
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"NOT A int32_t",&local_5d);
    error_message::error_message(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    uVar2 = extraout_RDX_00;
  }
  this->error_ = (error_message *)*in_RSI;
  *(int *)&this->variant_ = local_5c;
  nVar3._8_8_ = uVar2;
  nVar3.error_ = (error_message *)this;
  return nVar3;
}

Assistant:

number_validator<std::int32_t> sub_form::int32()
  {
    std::int32_t val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A int32_t");
    return number_validator<std::int32_t>(val, this->error_);
  }